

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadXYZnodeBody::ChLoadXYZnodeBody
          (ChLoadXYZnodeBody *this,shared_ptr<chrono::ChNodeXYZ> *mnodeA,
          shared_ptr<chrono::ChBody> *mbodyB)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<chrono::ChLoadable> local_f8;
  shared_ptr<chrono::ChLoadable> local_e8;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b0;
  
  peVar1 = (mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((long)(peVar1->pos).m_data + *(long *)((long)peVar1->super_ChLoadableUVW + -0x78) + -8);
  }
  local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  peVar2 = (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[-3] + -0x78 +
         (long)(&(peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord
               + 0xffffffffffffffff) + 0x30);
  }
  local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  ChLoadCustomMultiple::ChLoadCustomMultiple(&this->super_ChLoadCustomMultiple,&local_e8,&local_f8);
  if (local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZnodeBody_00b49888;
  local_b0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[2] = 0.0;
  (this->loc_application_B)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->loc_application_B).coord.pos.m_data[0] = 0.0;
  (this->loc_application_B).coord.pos.m_data[1] = 0.0;
  (this->loc_application_B).coord.pos.m_data[2] = 0.0;
  (this->loc_application_B).coord.rot.m_data[0] = 1.0;
  (this->loc_application_B).coord.rot.m_data[1] = 0.0;
  (this->loc_application_B).coord.rot.m_data[2] = 0.0;
  (this->loc_application_B).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33
            (&(this->loc_application_B).Amatrix,(ChQuaternion<double> *)&local_b0);
  (this->computed_loc_force).m_data[0] = 0.0;
  (this->computed_loc_force).m_data[1] = 0.0;
  (this->computed_loc_force).m_data[2] = 0.0;
  local_d8.m_data[2] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_b0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&this->frame_Aw,(ChVector<double> *)&local_d8,(ChQuaternion<double> *)&local_b0);
  local_d8.m_data[2] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_b0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&this->frame_Bw,(ChVector<double> *)&local_d8,(ChQuaternion<double> *)&local_b0);
  peVar1 = (mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d8.m_data[0] = 1.0;
  local_d8.m_data[1] = 0.0;
  local_d8.m_data[2] = 0.0;
  local_d8.m_data[3] = 0.0;
  local_b0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_b0.coord.pos.m_data[0] = (peVar1->pos).m_data[0];
  local_b0.coord.pos.m_data[1] = (peVar1->pos).m_data[1];
  local_b0.coord.pos.m_data[2] = (peVar1->pos).m_data[2];
  local_b0.coord.rot.m_data[0] = 1.0;
  local_b0.coord.rot.m_data[1] = 0.0;
  local_b0.coord.rot.m_data[2] = 0.0;
  local_b0.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_b0.Amatrix,&local_d8);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)
             &((mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ChBodyFrame,&local_b0,&this->loc_application_B);
  if (this != (ChLoadXYZnodeBody *)0xb909c8) {
    (this->computed_loc_force).m_data[0] = VNULL;
    (this->computed_loc_force).m_data[1] = DAT_00b90ac0;
    (this->computed_loc_force).m_data[2] = DAT_00b90ac8;
  }
  return;
}

Assistant:

ChLoadXYZnodeBody::ChLoadXYZnodeBody(std::shared_ptr<ChNodeXYZ> mnodeA,
									 std::shared_ptr<ChBody> mbodyB)
					: ChLoadCustomMultiple(mnodeA, mbodyB) {
	ChFrame<> abs_application(mnodeA->GetPos());
    mbodyB->ChFrame::TransformParentToLocal(abs_application, loc_application_B);
	computed_loc_force = VNULL;
}